

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O1

int __thiscall HighsLinearSumBounds::remove(HighsLinearSumBounds *this,char *__filename)

{
  double *pdVar1;
  int *piVar2;
  pointer piVar3;
  pointer pHVar4;
  double *pdVar5;
  int in_EDX;
  double *pdVar6;
  int iVar7;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  iVar7 = (int)__filename;
  if (this->implVarLowerSource[in_EDX] == iVar7) {
    pdVar5 = this->varLower + in_EDX;
  }
  else {
    pdVar5 = this->implVarLower + in_EDX;
    dVar9 = this->varLower[in_EDX];
    if (*pdVar5 <= dVar9 && dVar9 != *pdVar5) {
      pdVar5 = this->varLower + in_EDX;
    }
  }
  if (this->implVarUpperSource[in_EDX] == iVar7) {
    pdVar6 = this->varUpper + in_EDX;
  }
  else {
    pdVar1 = this->varUpper + in_EDX;
    dVar9 = this->implVarUpper[in_EDX];
    pdVar6 = this->implVarUpper + in_EDX;
    if (*pdVar1 <= dVar9 && dVar9 != *pdVar1) {
      pdVar6 = pdVar1;
    }
  }
  dVar9 = *pdVar5;
  dVar8 = *pdVar6;
  if (in_XMM0_Qa <= 0.0) {
    if (dVar8 < INFINITY) {
      dVar8 = dVar8 * in_XMM0_Qa;
      pHVar4 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar10 = pHVar4[iVar7].hi;
      dVar11 = dVar10 - dVar8;
      pHVar4[iVar7].hi = dVar11;
      pHVar4[iVar7].lo =
           (dVar10 - (dVar8 + dVar11)) + (-dVar8 - (dVar11 - (dVar8 + dVar11))) + pHVar4[iVar7].lo;
    }
    else {
      piVar2 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar7;
      *piVar2 = *piVar2 + -1;
    }
    if (-INFINITY < dVar9) {
      dVar9 = dVar9 * in_XMM0_Qa;
      pHVar4 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar8 = pHVar4[iVar7].hi;
      dVar10 = dVar8 - dVar9;
      pHVar4[iVar7].hi = dVar10;
      pHVar4[iVar7].lo =
           (dVar8 - (dVar9 + dVar10)) + (-dVar9 - (dVar10 - (dVar9 + dVar10))) + pHVar4[iVar7].lo;
    }
    else {
      piVar2 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar7;
      *piVar2 = *piVar2 + -1;
    }
    if (this->varUpper[in_EDX] < INFINITY) {
      dVar8 = this->varUpper[in_EDX] * in_XMM0_Qa;
      pHVar4 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar9 = pHVar4[iVar7].hi;
      dVar10 = dVar9 - dVar8;
      pHVar4[iVar7].hi = dVar10;
      pHVar4[iVar7].lo =
           (dVar9 - (dVar8 + dVar10)) + (-dVar8 - (dVar10 - (dVar8 + dVar10))) + pHVar4[iVar7].lo;
    }
    else {
      piVar2 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar7;
      *piVar2 = *piVar2 + -1;
    }
    dVar9 = this->varLower[in_EDX];
    if (-INFINITY < dVar9) goto LAB_0037d545;
  }
  else {
    if (-INFINITY < dVar9) {
      dVar9 = dVar9 * in_XMM0_Qa;
      pHVar4 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar10 = pHVar4[iVar7].hi;
      dVar11 = dVar10 - dVar9;
      pHVar4[iVar7].hi = dVar11;
      pHVar4[iVar7].lo =
           (dVar10 - (dVar9 + dVar11)) + (-dVar9 - (dVar11 - (dVar9 + dVar11))) + pHVar4[iVar7].lo;
    }
    else {
      piVar2 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar7;
      *piVar2 = *piVar2 + -1;
    }
    if (dVar8 < INFINITY) {
      dVar8 = dVar8 * in_XMM0_Qa;
      pHVar4 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar9 = pHVar4[iVar7].hi;
      dVar10 = dVar9 - dVar8;
      pHVar4[iVar7].hi = dVar10;
      pHVar4[iVar7].lo =
           (dVar9 - (dVar8 + dVar10)) + (-dVar8 - (dVar10 - (dVar8 + dVar10))) + pHVar4[iVar7].lo;
    }
    else {
      piVar2 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar7;
      *piVar2 = *piVar2 + -1;
    }
    if (-INFINITY < this->varLower[in_EDX]) {
      dVar8 = this->varLower[in_EDX] * in_XMM0_Qa;
      pHVar4 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar9 = pHVar4[iVar7].hi;
      dVar10 = dVar9 - dVar8;
      pHVar4[iVar7].hi = dVar10;
      pHVar4[iVar7].lo =
           (dVar9 - (dVar8 + dVar10)) + (-dVar8 - (dVar10 - (dVar8 + dVar10))) + pHVar4[iVar7].lo;
    }
    else {
      piVar2 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar7;
      *piVar2 = *piVar2 + -1;
    }
    dVar9 = this->varUpper[in_EDX];
    if (dVar9 < INFINITY) {
LAB_0037d545:
      dVar9 = dVar9 * in_XMM0_Qa;
      pHVar4 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar8 = pHVar4[iVar7].hi;
      dVar10 = dVar8 - dVar9;
      pHVar4[iVar7].hi = dVar10;
      pHVar4[iVar7].lo =
           (dVar8 - (dVar9 + dVar10)) + (-dVar9 - (dVar10 - (dVar9 + dVar10))) + pHVar4[iVar7].lo;
      return (int)pHVar4;
    }
  }
  piVar3 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = piVar3 + iVar7;
  *piVar2 = *piVar2 + -1;
  return (int)piVar3;
}

Assistant:

void HighsLinearSumBounds::remove(HighsInt sum, HighsInt var,
                                  double coefficient) {
  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);
  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    // coefficient is positive, therefore variable lower contributes to sum
    // lower bound
    if (vLower == -kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= vLower * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= vUpper * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= varLower[var] * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= varUpper[var] * coefficient;
  } else {
    // coefficient is negative, therefore variable upper contributes to sum
    // lower bound
    if (vUpper == kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= vUpper * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= vLower * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= varUpper[var] * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= varLower[var] * coefficient;
  }
}